

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend-c-api-impl.cc
# Opt level: O0

QPDF_ERROR_CODE num_pages(qpdf_data qc,int *npages)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_16_2_5c57cf5d local_48;
  function<void_()> local_38;
  int *local_18;
  int *npages_local;
  qpdf_data qc_local;
  
  local_48.qc = (qpdf_data *)&npages_local;
  local_48.npages = &local_18;
  local_18 = npages;
  npages_local = (int *)qc;
  std::function<void()>::function<num_pages::__0,void>((function<void()> *)&local_38,&local_48);
  QVar1 = qpdf_c_wrap(qc,&local_38);
  std::function<void_()>::~function(&local_38);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
num_pages(qpdf_data qc, int* npages)
{
    // Call qpdf_c_wrap to convert any exception our function might through to a QPDF_ERROR_CODE
    // and attach it to the qpdf_data object in the same way as other functions in the C API.
    return qpdf_c_wrap(qc, [&qc, &npages]() { *npages = numPages(qpdf_c_get_qpdf(qc)); });
}